

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void build_chk2_cmp2(m68k_info *info,int size)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  MCInst_setOpcode(info->inst,0x2e);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1.cpu_size = size;
  uVar3 = info->pc;
  uVar2 = (ulong)(uVar3 - (int)info->baseAddress & info->address_mask);
  if (info->code_len < uVar2 + 2) {
    info->pc = uVar3 + 2;
    uVar4 = 0xaaaa;
    uVar3 = 0x2e;
  }
  else {
    bVar1 = info->code[uVar2];
    uVar4 = (uint)CONCAT11(bVar1,info->code[uVar2 + 1]);
    info->pc = uVar3 + 2;
    uVar3 = 0x2e;
    if ((bVar1 & 8) == 0) {
      uVar3 = 0x34;
    }
  }
  MCInst_setOpcode(info->inst,uVar3);
  get_ea_mode_op(info,(info->extension).operands,info->ir,size);
  (info->extension).operands[1].type = M68K_OP_REG;
  (info->extension).operands[1].address_mode = M68K_AM_NONE;
  (info->extension).operands[1].field_0.reg =
       (uVar4 >> 0xc & 7) + (uint)(0x7fff < uVar4) * 8 + M68K_REG_D0;
  return;
}

Assistant:

static void build_chk2_cmp2(m68k_info *info, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_CHK2, 2, size);

	uint extension = read_imm_16(info);

	if (BIT_B(extension))
		MCInst_setOpcode(info->inst, M68K_INS_CHK2);
	else
		MCInst_setOpcode(info->inst, M68K_INS_CMP2);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, size);

	op1->address_mode = M68K_AM_NONE;
	op1->type = M68K_OP_REG;
	op1->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
}